

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O1

unique_ptr<verilogAST::ModuleInstantiation,_std::default_delete<verilogAST::ModuleInstantiation>_>
__thiscall
verilogAST::Transformer::visit
          (Transformer *this,
          unique_ptr<verilogAST::ModuleInstantiation,_std::default_delete<verilogAST::ModuleInstantiation>_>
          *node)

{
  long lVar1;
  long *plVar2;
  _Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
  _Var3;
  long *in_RDX;
  long lVar4;
  __index_type *p_Var5;
  _Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
  local_80;
  byte local_78;
  long *local_70;
  long *local_68;
  variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
  local_60;
  variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
  *local_50;
  long *local_48;
  _Head_base<0UL,_verilogAST::ModuleInstantiation_*,_false> local_40;
  undefined1 *local_38;
  
  lVar4 = **(long **)(*in_RDX + 0x60);
  lVar1 = (*(long **)(*in_RDX + 0x60))[1];
  local_40._M_head_impl = (ModuleInstantiation *)this;
  if (lVar4 != lVar1) {
    do {
      local_68 = *(long **)(lVar4 + 0x20);
      *(undefined8 *)(lVar4 + 0x20) = 0;
      (**(code **)(node->_M_t).
                  super___uniq_ptr_impl<verilogAST::ModuleInstantiation,_std::default_delete<verilogAST::ModuleInstantiation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_verilogAST::ModuleInstantiation_*,_std::default_delete<verilogAST::ModuleInstantiation>_>
                  .super__Head_base<0UL,_verilogAST::ModuleInstantiation_*,_false>._M_head_impl)
                (&local_80,node,&local_68);
      _Var3 = local_80;
      local_80 = (_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                  )0x0;
      plVar2 = *(long **)(lVar4 + 0x20);
      *(_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
        *)(lVar4 + 0x20) = _Var3;
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 0x10))();
      }
      if (local_80 !=
          (_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
           )0x0) {
        (**(code **)(*(long *)local_80 + 0x10))();
      }
      local_80 = (_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                  )0x0;
      if (local_68 != (long *)0x0) {
        (**(code **)(*local_68 + 0x10))();
      }
      local_68 = (long *)0x0;
      lVar4 = lVar4 + 0x28;
    } while (lVar4 != lVar1);
  }
  p_Var5 = *(__index_type **)(*in_RDX + 0x28);
  local_38 = *(undefined1 **)(*in_RDX + 0x30);
  local_48 = in_RDX;
  if (p_Var5 != local_38) {
    do {
      local_60.
      super__Variant_base<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
      .
      super__Move_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      .
      super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      .
      super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      .
      super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      .
      super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      ._M_index = p_Var5[8];
      local_50 = &local_60;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>_&&>
        ::_S_vtable._M_arr[p_Var5[8]]._M_data)
                ((anon_class_8_1_a78179b7_conflict *)&local_50,
                 (variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                  *)p_Var5);
      (*(code *)(node->_M_t).
                super___uniq_ptr_impl<verilogAST::ModuleInstantiation,_std::default_delete<verilogAST::ModuleInstantiation>_>
                ._M_t.
                super__Tuple_impl<0UL,_verilogAST::ModuleInstantiation_*,_std::default_delete<verilogAST::ModuleInstantiation>_>
                .super__Head_base<0UL,_verilogAST::ModuleInstantiation_*,_false>._M_head_impl[1].
                module_name.field_2._M_allocated_capacity)(&local_80,node,&local_60);
      local_50 = (variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                  *)p_Var5;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>_&>
        ::_S_vtable._M_arr[local_78]._M_data)
                ((anon_class_8_1_8991fb9c_conflict1 *)&local_50,
                 (variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                  *)&local_80._M_first);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>_&>
        ::_S_vtable._M_arr[local_78]._M_data)
                ((anon_class_1_0_00000001 *)&local_50,
                 (variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                  *)&local_80._M_first);
      local_78 = 0xff;
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>_&>
        ::_S_vtable._M_arr
        [local_60.
         super__Variant_base<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
         .
         super__Move_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
         .
         super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
         .
         super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
         .
         super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
         .
         super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
         ._M_index]._M_data)((anon_class_1_0_00000001 *)&local_50,&local_60);
      local_60.
      super__Variant_base<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
      .
      super__Move_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      .
      super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      .
      super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      .
      super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      .
      super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      ._M_index = 0xff;
      local_70 = *(long **)&(((variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                               *)(p_Var5 + 0x10))->
                            super__Variant_base<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                            ).
                            super__Move_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
                            .
                            super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
                            .
                            super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
                            .
                            super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      ;
      *(undefined8 *)
       &(((variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
           *)(p_Var5 + 0x10))->
        super__Variant_base<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
        ).
        super__Move_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
        .
        super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
        .
        super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
        .
        super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
           = 0;
      (**(code **)(node->_M_t).
                  super___uniq_ptr_impl<verilogAST::ModuleInstantiation,_std::default_delete<verilogAST::ModuleInstantiation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_verilogAST::ModuleInstantiation_*,_std::default_delete<verilogAST::ModuleInstantiation>_>
                  .super__Head_base<0UL,_verilogAST::ModuleInstantiation_*,_false>._M_head_impl)
                (&local_80,node,&local_70);
      _Var3 = local_80;
      local_80 = (_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                  )0x0;
      plVar2 = *(long **)&(((variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                             *)(p_Var5 + 0x10))->
                          super__Variant_base<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                          ).
                          super__Move_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
                          .
                          super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
                          .
                          super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
                          .
                          super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
      ;
      *(_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
        *)(p_Var5 + 0x10) = _Var3;
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 0x10))();
      }
      if (local_80 !=
          (_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
           )0x0) {
        (**(code **)(*(long *)local_80 + 0x10))();
      }
      local_80 = (_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                  )0x0;
      if (local_70 != (long *)0x0) {
        (**(code **)(*local_70 + 0x10))();
      }
      local_70 = (long *)0x0;
      p_Var5 = p_Var5 + 0x18;
    } while (p_Var5 != local_38);
  }
  *(long *)local_40._M_head_impl = *local_48;
  *local_48 = 0;
  return (__uniq_ptr_data<verilogAST::ModuleInstantiation,_std::default_delete<verilogAST::ModuleInstantiation>,_true,_true>
          )(tuple<verilogAST::ModuleInstantiation_*,_std::default_delete<verilogAST::ModuleInstantiation>_>
            )local_40._M_head_impl;
}

Assistant:

std::unique_ptr<ModuleInstantiation> Transformer::visit(
    std::unique_ptr<ModuleInstantiation> node) {
  for (auto&& conn : *node->connections) {
    conn.second = this->visit(std::move(conn.second));
  }
  for (auto&& param : node->parameters) {
    param.first = this->visit(std::move(param.first));
    param.second = this->visit(std::move(param.second));
  }
  return node;
}